

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_usage.cpp
# Opt level: O3

bool init_vulkan(void)

{
  VkResult __val;
  uint uVar1;
  VkResult VVar2;
  InstanceBuilder *pIVar3;
  GLFWwindow *handle;
  VkInstance instance;
  PhysicalDeviceSelector *pPVar4;
  ostream *poVar5;
  uint uVar6;
  fd_set *__writefds;
  long lVar7;
  char *__function;
  ulong uVar8;
  fd_set *__readfds;
  char cVar9;
  anon_union_96_2_293c120a_for_Result<vkb::Swapchain>_1 *paVar10;
  Swapchain *pSVar11;
  fd_set *__exceptfds;
  timeval *in_R9;
  uint __len;
  byte bVar12;
  VkSurfaceKHR surface;
  Result<VkQueue_T_*> graphics_queue_ret;
  Instance vkb_inst;
  Result<vkb::Instance> inst_ret;
  SwapchainBuilder swapchain_builder;
  Swapchain vkb_swapchain;
  InstanceBuilder builder;
  Result<vkb::Swapchain> swap_ret;
  Result<vkb::Device> dev_ret;
  PhysicalDeviceSelector selector;
  Device vkb_device;
  Result<vkb::PhysicalDevice> phys_ret;
  DeviceBuilder device_builder;
  undefined1 local_2830 [8];
  Result<VkQueue_T_*> local_2828;
  Instance local_2808;
  anon_union_56_2_293c120a_for_Result<vkb::Instance>_1 local_27c8;
  char local_2790;
  undefined1 local_2788 [16];
  pointer local_2778;
  pointer local_2768;
  pointer local_2750;
  pointer local_2740;
  pointer local_2708;
  pointer local_26f8;
  undefined1 local_26d8 [16];
  long local_26c8;
  InstanceBuilder local_2678;
  anon_union_96_2_293c120a_for_Result<vkb::Swapchain>_1 local_2590;
  char local_2530;
  undefined1 local_2528 [16];
  VkDevice_T local_2518 [1728];
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> avStack_1e58 [2];
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  bool local_1e18;
  PhysicalDeviceSelector local_1e10;
  undefined1 local_1bb8 [16];
  size_type local_1ba8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ba0 [100];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1540;
  pointer local_1528;
  pointer local_1518;
  pointer local_1510;
  pointer local_1500;
  VkSurfaceKHR local_14f0;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_14e8;
  VkAllocationCallbacks *local_14d0;
  PFN_vkGetDeviceProcAddr p_Stack_14c8;
  undefined8 local_14c0;
  PFN_vkGetDeviceQueue p_Stack_14b8;
  PFN_vkDestroyDevice local_14b0;
  PhysicalDevice local_14a8;
  anon_union_1728_2_293c120a_for_Result<vkb::PhysicalDevice>_1 local_de8;
  char local_728;
  DeviceBuilder local_720;
  
  bVar12 = 0;
  vkb::InstanceBuilder::InstanceBuilder(&local_2678);
  pIVar3 = vkb::InstanceBuilder::set_app_name(&local_2678,"Example Vulkan Application");
  pIVar3 = vkb::InstanceBuilder::request_validation_layers(pIVar3,true);
  pIVar3 = vkb::InstanceBuilder::use_default_debug_messenger(pIVar3);
  vkb::InstanceBuilder::build((Result<vkb::Instance> *)&local_27c8.m_value,pIVar3);
  if (local_2790 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create Vulkan instance. Error: ",0x29);
    if (local_2790 == '\x01') {
      __function = "std::error_code vkb::Result<vkb::Instance>::error() const [T = vkb::Instance]";
      goto LAB_001098dc;
    }
    (**(code **)(*(long *)local_27c8.m_value.debug_messenger + 0x20))
              (local_2528,local_27c8.m_value.debug_messenger,local_27c8.m_error.type._M_value);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_2528._0_8_,local_2528._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((VkDevice_T *)local_2528._0_8_ != local_2518) goto LAB_00109192;
  }
  else {
    local_2808.headless = local_27c8.m_value.headless;
    local_2808.properties2_ext_enabled = local_27c8.m_value.properties2_ext_enabled;
    local_2808._50_6_ = local_27c8._50_6_;
    local_2808.fp_vkGetDeviceProcAddr = local_27c8.m_value.fp_vkGetDeviceProcAddr;
    local_2808.instance_version = local_27c8.m_value.instance_version;
    local_2808.api_version = local_27c8.m_value.api_version;
    local_2808.allocation_callbacks = local_27c8.m_value.allocation_callbacks;
    local_2808.fp_vkGetInstanceProcAddr = local_27c8.m_value.fp_vkGetInstanceProcAddr;
    local_2808.debug_messenger = local_27c8.m_value.debug_messenger;
    glfwInit();
    glfwWindowHint(0x22001,0);
    __exceptfds = (fd_set *)0x0;
    handle = glfwCreateWindow(0x400,0x400,"Vulkan Triangle",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    local_2830 = (undefined1  [8])0x0;
    instance = vkb::Instance::operator_cast_to_VkInstance_T_(&local_2808);
    __writefds = (fd_set *)local_2830;
    VVar2 = glfwCreateWindowSurface
                      (instance,handle,(VkAllocationCallbacks *)0x0,
                       (VkSurfaceKHR_conflict *)__writefds);
    if (VVar2 == VK_SUCCESS) {
      vkb::PhysicalDeviceSelector::PhysicalDeviceSelector(&local_1e10,&local_2808);
      pPVar4 = vkb::PhysicalDeviceSelector::set_surface(&local_1e10,(VkSurfaceKHR)local_2830);
      vkb::PhysicalDeviceSelector::select
                ((PhysicalDeviceSelector *)&local_de8.m_value,(int)pPVar4,__readfds,__writefds,
                 __exceptfds,in_R9);
      if (local_728 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to select Vulkan Physical Device. Error: ",0x30);
        if (local_728 == '\x01') {
          __function = 
          "std::error_code vkb::Result<vkb::PhysicalDevice>::error() const [T = vkb::PhysicalDevice]"
          ;
LAB_001098dc:
          __assert_fail("!m_init",
                        "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.h"
                        ,0x8c,__function);
        }
        (**(code **)(*(long *)local_de8.m_error.type._M_cat + 0x20))
                  (local_2528,local_de8.m_value.name._M_string_length,
                   local_de8.m_error.type._M_value);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_2528._0_8_,local_2528._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((VkDevice_T *)local_2528._0_8_ != local_2518) {
          operator_delete((void *)local_2528._0_8_,local_2518._0_8_ + 1);
        }
        cVar9 = '\0';
      }
      else {
        vkb::PhysicalDevice::PhysicalDevice(&local_14a8,&local_de8.m_value);
        vkb::DeviceBuilder::DeviceBuilder(&local_720,&local_14a8);
        if (local_14a8.extended_features_chain.nodes.
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_14a8.extended_features_chain.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_14a8.extended_features_chain.nodes.
                                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_14a8.extended_features_chain.nodes.
                                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_14a8.queue_families.
            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_14a8.queue_families.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_14a8.queue_families.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_14a8.queue_families.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_14a8.available_extensions);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_14a8.extensions_to_enable);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_14a8.name._M_dataplus._M_p != &local_14a8.name.field_2) {
          operator_delete(local_14a8.name._M_dataplus._M_p,
                          local_14a8.name.field_2._M_allocated_capacity + 1);
        }
        vkb::DeviceBuilder::build((Result<vkb::Device> *)local_2528,&local_720);
        if (local_1e18 == false) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to create Vulkan device. Error: ",0x27);
          if (local_1e18 == true) {
            __function = "std::error_code vkb::Result<vkb::Device>::error() const [T = vkb::Device]"
            ;
            goto LAB_001098dc;
          }
          (**(code **)(*(long *)local_2528._8_8_ + 0x20))
                    (local_1bb8,local_2528._8_8_,local_2528._0_8_ & 0xffffffff);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_1bb8._0_8_,local_1bb8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((VkDevice_T *)local_1bb8._0_8_ != (VkDevice_T *)&local_1ba8) {
            operator_delete((void *)local_1bb8._0_8_,local_1ba8 + 1);
          }
          cVar9 = '\0';
        }
        else {
          local_1bb8._0_8_ = local_2528._0_8_;
          vkb::PhysicalDevice::PhysicalDevice
                    ((PhysicalDevice *)(local_1bb8 + 8),(PhysicalDevice *)(local_2528 + 8));
          local_14f0 = (VkSurfaceKHR)local_2518._1720_8_;
          std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::vector
                    (&local_14e8,avStack_1e58);
          local_14b0 = (PFN_vkDestroyDevice)local_1e20;
          local_14c0 = avStack_1e58[1].
                       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          p_Stack_14b8 = (PFN_vkGetDeviceQueue)uStack_1e28;
          local_14d0 = (VkAllocationCallbacks *)
                       avStack_1e58[1].
                       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          p_Stack_14c8 = (PFN_vkGetDeviceProcAddr)
                         avStack_1e58[1].
                         super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          vkb::Device::get_queue(&local_2828,(Device *)local_1bb8,graphics);
          if (local_2828.m_init == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Failed to get graphics queue. Error: ",0x25);
            if (local_2828.m_init == true) {
              __function = 
              "std::error_code vkb::Result<VkQueue_T *>::error() const [T = VkQueue_T *]";
              goto LAB_001098dc;
            }
            (**(code **)(*(long *)local_2828.field_0.m_error.type._M_cat + 0x20))
                      (local_2788,local_2828.field_0.m_error.type._M_cat,
                       local_2828.field_0.m_error.type._M_value);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_2788._0_8_,local_2788._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if ((VkPhysicalDevice)local_2788._0_8_ != (VkPhysicalDevice)&local_2778) {
              operator_delete((void *)local_2788._0_8_,(long)local_2778 + 1);
            }
            cVar9 = '\0';
          }
          else {
            vkb::SwapchainBuilder::SwapchainBuilder
                      ((SwapchainBuilder *)local_2788,(Device *)local_1bb8);
            vkb::SwapchainBuilder::build
                      ((Result<vkb::Swapchain> *)&local_2590.m_value,(SwapchainBuilder *)local_2788)
            ;
            if (local_2530 == '\0') {
              (**(code **)(*(long *)local_2590.m_value.swapchain + 0x20))
                        (local_26d8,local_2590.m_value.swapchain,local_2590.m_error.type._M_value);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_26d8._0_8_,local_26d8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              if ((VkDevice)local_26d8._0_8_ != (VkDevice)&local_26c8) {
                operator_delete((void *)local_26d8._0_8_,local_26c8 + 1);
              }
            }
            else {
              paVar10 = &local_2590;
              pSVar11 = (Swapchain *)local_26d8;
              for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
                pSVar11->device = (paVar10->m_value).device;
                paVar10 = (anon_union_96_2_293c120a_for_Result<vkb::Swapchain>_1 *)
                          ((long)paVar10 + ((ulong)bVar12 * -2 + 1) * 8);
                pSVar11 = (Swapchain *)((long)pSVar11 + (ulong)bVar12 * -0x10 + 8);
              }
              vkb::destroy_swapchain((Swapchain *)local_26d8);
              vkb::destroy_device((Device *)local_1bb8);
              vkb::destroy_surface(&local_2808,(VkSurfaceKHR)local_2830);
              vkb::destroy_instance(&local_2808);
              glfwDestroyWindow(handle);
              glfwTerminate();
            }
            if (local_2708 != (pointer)0x0) {
              operator_delete(local_2708,(long)local_26f8 - (long)local_2708);
            }
            if (local_2750 != (pointer)0x0) {
              operator_delete(local_2750,(long)local_2740 - (long)local_2750);
            }
            cVar9 = local_2530;
            if (local_2778 != (pointer)0x0) {
              operator_delete(local_2778,(long)local_2768 - (long)local_2778);
            }
          }
          if (local_14e8.
              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_14e8.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_14e8.
                                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_14e8.
                                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1510 != (pointer)0x0) {
            operator_delete(local_1510,(long)local_1500 - (long)local_1510);
          }
          if (local_1528 != (pointer)0x0) {
            operator_delete(local_1528,(long)local_1518 - (long)local_1528);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1540);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1558);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1bb8._8_8_ != local_1ba0) {
            operator_delete((void *)local_1bb8._8_8_,local_1ba0[0]._M_allocated_capacity + 1);
          }
        }
        vkb::Result<vkb::Device>::destroy((Result<vkb::Device> *)local_2528);
        vkb::DeviceBuilder::~DeviceBuilder(&local_720);
      }
      vkb::Result<vkb::PhysicalDevice>::destroy((Result<vkb::PhysicalDevice> *)&local_de8.m_value);
      if (local_1e10.criteria.extended_features_chain.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e10.criteria.extended_features_chain.nodes.
                        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e10.criteria.extended_features_chain.nodes.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e10.criteria.extended_features_chain.nodes.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e10.criteria.required_extensions);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e10.criteria.name._M_dataplus._M_p != &local_1e10.criteria.name.field_2) {
        operator_delete(local_1e10.criteria.name._M_dataplus._M_p,
                        local_1e10.criteria.name.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001091a4;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to select create window surface. Error: ",0x2f);
    __val = -VVar2;
    if (VK_SUCCESS < VVar2) {
      __val = VVar2;
    }
    __len = 1;
    if (9 < (uint)__val) {
      uVar8 = (ulong)(uint)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar6 = (uint)uVar8;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_001095db;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_001095db;
        }
        if (uVar6 < 10000) goto LAB_001095db;
        uVar8 = uVar8 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_001095db:
    local_2528._0_8_ = local_2518;
    std::__cxx11::string::_M_construct((ulong)local_2528,(char)__len - (char)(VVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_2528._0_8_ + (ulong)((uint)VVar2 >> 0x1f)),__len,__val);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_2528._0_8_,local_2528._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((VkDevice_T *)local_2528._0_8_ != local_2518) {
LAB_00109192:
      operator_delete((void *)local_2528._0_8_,local_2518._0_8_ + 1);
    }
  }
  cVar9 = '\0';
LAB_001091a4:
  if (local_2678.info.disabled_validation_features.
      super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2678.info.disabled_validation_features.
                    super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2678.info.disabled_validation_features.
                          super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2678.info.disabled_validation_features.
                          super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2678.info.enabled_validation_features.
      super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2678.info.enabled_validation_features.
                    super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2678.info.enabled_validation_features.
                          super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2678.info.enabled_validation_features.
                          super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2678.info.disabled_validation_checks.
      super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2678.info.disabled_validation_checks.
                    super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2678.info.disabled_validation_checks.
                          super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2678.info.disabled_validation_checks.
                          super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2678.info.pNext_elements.
      super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2678.info.pNext_elements.
                    super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2678.info.pNext_elements.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2678.info.pNext_elements.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2678.info.extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2678.info.extensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2678.info.extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2678.info.extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2678.info.layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2678.info.layers.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2678.info.layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2678.info.layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)cVar9;
}

Assistant:

bool init_vulkan() {
    vkb::InstanceBuilder builder;
    auto inst_ret =
        builder.set_app_name("Example Vulkan Application").request_validation_layers().use_default_debug_messenger().build();
    if (!inst_ret) {
        std::cerr << "Failed to create Vulkan instance. Error: " << inst_ret.error().message() << "\n";
        return false;
    }
    vkb::Instance vkb_inst = inst_ret.value();

    glfwInit();
    glfwWindowHint(GLFW_CLIENT_API, GLFW_NO_API);
    GLFWwindow* window = glfwCreateWindow(1024, 1024, "Vulkan Triangle", NULL, NULL);

    VkSurfaceKHR surface = VK_NULL_HANDLE;
    VkResult glfw_result = glfwCreateWindowSurface(vkb_inst, window, nullptr, &surface);
    if (glfw_result != VK_SUCCESS) {
        std::cerr << "Failed to select create window surface. Error: " << std::to_string(glfw_result) << "\n";
        return false;
    }

    vkb::PhysicalDeviceSelector selector{ vkb_inst };
    auto phys_ret = selector.set_surface(surface).select();
    if (!phys_ret) {
        std::cerr << "Failed to select Vulkan Physical Device. Error: " << phys_ret.error().message() << "\n";
        return false;
    }

    vkb::DeviceBuilder device_builder{ phys_ret.value() };
    // automatically propagate needed data from instance & physical device
    auto dev_ret = device_builder.build();
    if (!dev_ret) {
        std::cerr << "Failed to create Vulkan device. Error: " << dev_ret.error().message() << "\n";
        return false;
    }
    vkb::Device vkb_device = dev_ret.value();

    // Get the VkDevice handle used in the rest of a vulkan application
    VkDevice device = vkb_device.device;

    // Get the graphics queue with a helper function
    auto graphics_queue_ret = vkb_device.get_queue(vkb::QueueType::graphics);
    if (!graphics_queue_ret) {
        std::cerr << "Failed to get graphics queue. Error: " << graphics_queue_ret.error().message() << "\n";
        return false;
    }
    VkQueue graphics_queue = graphics_queue_ret.value();

    vkb::SwapchainBuilder swapchain_builder{ vkb_device };
    auto swap_ret = swapchain_builder.build();
    if (!swap_ret) {
        std::cout << swap_ret.error().message() << "\n";
        return false;
    }
    vkb::Swapchain vkb_swapchain = swap_ret.value();

    // We did it!
    // Turned 400-500 lines of boilerplate into a fraction of that.

    // Time to cleanup
    vkb::destroy_swapchain(vkb_swapchain);
    vkb::destroy_device(vkb_device);
    vkb::destroy_surface(vkb_inst, surface);
    vkb::destroy_instance(vkb_inst);
    glfwDestroyWindow(window);
    glfwTerminate();
    (void)device; // silence unused warning
    (void)graphics_queue;
    return true;
}